

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeOverwriteCell(BtCursor *pCur,BtreePayload *pX)

{
  uint uVar1;
  u32 flags;
  int iVar2;
  int iVar3;
  uint uVar4;
  MemPage *in_RSI;
  long in_RDI;
  u32 ovflPageSize;
  Pgno ovflPgno;
  BtShared *pBt;
  MemPage *pPage;
  int rc;
  int nTotal;
  int iOffset;
  int local_40;
  MemPage **ppPage;
  long lVar5;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  uVar1 = *(int *)&in_RSI->field_0x24 + *(int *)in_RSI->apOvfl;
  lVar5 = *(long *)(in_RDI + 0x88);
  if (*(ulong *)(lVar5 + 0x58) <
      (ulong)(*(long *)(in_RDI + 0x38) + (long)(int)(uint)*(ushort *)(in_RDI + 0x44))) {
    local_4 = sqlite3CorruptError(0);
  }
  else {
    local_4 = btreeOverwriteContent
                        (in_RSI,(u8 *)CONCAT44(in_stack_ffffffffffffffe4,uVar1),
                         (BtreePayload *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (int)((ulong)lVar5 >> 0x20),(int)lVar5);
    if (local_4 == 0) {
      if (*(ushort *)(in_RDI + 0x44) == uVar1) {
        local_4 = 0;
      }
      else {
        uVar4 = (uint)*(ushort *)(in_RDI + 0x44);
        flags = sqlite3Get4byte((u8 *)(*(long *)(in_RDI + 0x38) + (long)(int)uVar4));
        ppPage = *(MemPage ***)(lVar5 + 0x48);
        local_40 = *(int *)((long)ppPage + 0x34) + -4;
        do {
          iVar2 = btreeGetPage((BtShared *)CONCAT44(local_4,in_stack_ffffffffffffffd8),
                               (Pgno)((ulong)lVar5 >> 0x20),ppPage,flags);
          if (iVar2 != 0) {
            return iVar2;
          }
          iVar3 = sqlite3PagerPageRefcount((DbPage *)0x171110);
          if (iVar3 == 1) {
            if (uVar4 + local_40 < uVar1) {
              flags = sqlite3Get4byte(*(u8 **)(lVar5 + 0x50));
            }
            else {
              local_40 = uVar1 - uVar4;
            }
            iVar2 = btreeOverwriteContent
                              (in_RSI,(u8 *)CONCAT44(uVar4,uVar1),
                               (BtreePayload *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),
                               (int)((ulong)lVar5 >> 0x20),(int)lVar5);
          }
          else {
            iVar2 = sqlite3CorruptError(0);
          }
          sqlite3PagerUnref((DbPage *)0x17118a);
          if (iVar2 != 0) {
            return iVar2;
          }
          uVar4 = local_40 + uVar4;
          local_4 = 0;
        } while ((int)uVar4 < (int)uVar1);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int btreeOverwriteCell(BtCursor *pCur, const BtreePayload *pX){
  int iOffset;                        /* Next byte of pX->pData to write */
  int nTotal = pX->nData + pX->nZero; /* Total bytes of to write */
  int rc;                             /* Return code */
  MemPage *pPage = pCur->pPage;       /* Page being written */
  BtShared *pBt;                      /* Btree */
  Pgno ovflPgno;                      /* Next overflow page to write */
  u32 ovflPageSize;                   /* Size to write on overflow page */

  if( pCur->info.pPayload + pCur->info.nLocal > pPage->aDataEnd ){
    return SQLITE_CORRUPT_BKPT;
  }
  /* Overwrite the local portion first */
  rc = btreeOverwriteContent(pPage, pCur->info.pPayload, pX,
                             0, pCur->info.nLocal);
  if( rc ) return rc;
  if( pCur->info.nLocal==nTotal ) return SQLITE_OK;

  /* Now overwrite the overflow pages */
  iOffset = pCur->info.nLocal;
  assert( nTotal>=0 );
  assert( iOffset>=0 );
  ovflPgno = get4byte(pCur->info.pPayload + iOffset);
  pBt = pPage->pBt;
  ovflPageSize = pBt->usableSize - 4;
  do{
    rc = btreeGetPage(pBt, ovflPgno, &pPage, 0);
    if( rc ) return rc;
    if( sqlite3PagerPageRefcount(pPage->pDbPage)!=1 ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      if( iOffset+ovflPageSize<(u32)nTotal ){
        ovflPgno = get4byte(pPage->aData);
      }else{
        ovflPageSize = nTotal - iOffset;
      }
      rc = btreeOverwriteContent(pPage, pPage->aData+4, pX,
                                 iOffset, ovflPageSize);
    }
    sqlite3PagerUnref(pPage->pDbPage);
    if( rc ) return rc;
    iOffset += ovflPageSize;
  }while( iOffset<nTotal );
  return SQLITE_OK;    
}